

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IfStatement.cpp
# Opt level: O3

void __thiscall ninx::parser::element::IfStatement::set_parent(IfStatement *this,Block *parent)

{
  pointer puVar1;
  IfCase *pIVar2;
  Block *pBVar3;
  unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_> *c;
  pointer puVar4;
  
  (this->super_Statement).super_ASTElement.parent = parent;
  puVar1 = (this->cases).
           super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->cases).
                super__Vector_base<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>,_std::allocator<std::unique_ptr<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    pIVar2 = (puVar4->_M_t).
             super___uniq_ptr_impl<ninx::parser::element::IfCase,_std::default_delete<ninx::parser::element::IfCase>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::IfCase_*,_std::default_delete<ninx::parser::element::IfCase>_>
             .super__Head_base<0UL,_ninx::parser::element::IfCase_*,_false>._M_head_impl;
    (**(code **)((long)(pIVar2->super_ASTElement)._vptr_ASTElement + 0x20))(pIVar2,parent);
  }
  pBVar3 = (this->else_body)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
           .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
  if (pBVar3 != (Block *)0x0) {
    (**(code **)(*(long *)&(pBVar3->super_Expression).super_Statement + 0x20))(pBVar3,parent);
    return;
  }
  return;
}

Assistant:

void ninx::parser::element::IfStatement::set_parent(ninx::parser::element::Block *parent) {
    ASTElement::set_parent(parent);

    for (auto &c : cases) {
        c->set_parent(parent);
    }

    if (this->else_body) {
        this->else_body->set_parent(parent);
    }
}